

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

from_chars_result_t<char>
fast_float::from_chars<int,char,int>(char *first,char *last,int *value,int base)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  from_chars_result_t<char> fVar11;
  
  uVar5 = 0x16;
  pbVar6 = (byte *)first;
  if (base - 0x25U < 0xffffffdd || first == last) goto LAB_00131bec;
  cVar1 = *first;
  for (pbVar6 = (byte *)(first + (cVar1 == '-'));
      (pbVar7 = (byte *)last, pbVar6 != (byte *)last && (pbVar7 = pbVar6, *pbVar6 == 0x30));
      pbVar6 = pbVar6 + 1) {
  }
  pbVar10 = pbVar7;
  if (base == 10) {
    lVar8 = (long)last - (long)pbVar7;
    uVar4 = 0;
    while ((7 < lVar8 &&
           (uVar3 = *(long *)pbVar10 + 0xcfcfcfcfcfcfcfd0,
           ((*(long *)pbVar10 + 0x4646464646464646U | uVar3) & 0x8080808080808080) == 0))) {
      uVar3 = (uVar3 >> 8) + uVar3 * 10;
      uVar4 = ((uVar3 >> 0x10 & 0xff000000ff) * 0x271000000001 +
               (uVar3 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar4 * 100000000;
      pbVar10 = pbVar10 + 8;
      lVar8 = lVar8 + -8;
    }
  }
  else {
    lVar8 = (long)last - (long)pbVar7;
    uVar4 = 0;
  }
  uVar5 = 0x16;
  pbVar9 = pbVar10 + lVar8;
  while ((pbVar6 = pbVar9, pbVar10 != (byte *)last &&
         (pbVar6 = pbVar10, (int)(uint)int_luts<void>::chdigit[*pbVar10] < base))) {
    uVar4 = uVar4 * (uint)base + (ulong)int_luts<void>::chdigit[*pbVar10];
    pbVar10 = pbVar10 + 1;
  }
  if (pbVar6 == pbVar7) {
    pbVar6 = (byte *)first;
    iVar2 = 0;
    if (pbVar7 <= first + (cVar1 == '-')) goto LAB_00131bec;
  }
  else {
    uVar5 = 0x22;
    if (*(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0) <
        (ulong)((long)pbVar6 - (long)pbVar7)) goto LAB_00131bec;
    if ((long)pbVar6 - (long)pbVar7 == *(ulong *)(int_luts<void>::chdigit + (long)base * 8 + 0xf0))
    {
      uVar3 = 0x7fffffff;
      if (cVar1 == '-') {
        uVar3 = 0x80000000;
      }
      if (uVar4 < int_luts<void>::min_safe_u64[(long)base + -2]) goto LAB_00131bec;
    }
    else {
      uVar3 = 0x7fffffff;
      if (cVar1 == '-') {
        uVar3 = 0x80000000;
      }
    }
    if (uVar3 < uVar4) goto LAB_00131bec;
    pbVar7 = pbVar6;
    iVar2 = -(int)uVar4;
    if (cVar1 != '-') {
      iVar2 = (int)uVar4;
    }
  }
  *value = iVar2;
  uVar5 = 0;
  pbVar6 = pbVar7;
LAB_00131bec:
  fVar11._8_8_ = uVar5;
  fVar11.ptr = (char *)pbVar6;
  return fVar11;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars(UC const* first, UC const* last, T& value, int base) noexcept {
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last || base < 2 || base > 36) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  return parse_int_string(first, last, value, base);
}